

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O0

void free_sections(void)

{
  section_s *psVar1;
  section_t *next;
  section_t *local_8;
  
  local_8 = root;
  while (local_8 != (section_t *)0x0) {
    cur = local_8;
    psVar1 = local_8->next;
    free(local_8);
    local_8 = psVar1;
  }
  root = (section_t *)0x0;
  cur = (section_t *)0x0;
  return;
}

Assistant:

void free_sections()
{
    section_t* next = root;
    while (next)
    {
        cur = next;
        next = cur->next;
        free(cur);
    }
    root = NULL;
    cur = NULL;
}